

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::maxwell_dist<double>::icdf(maxwell_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  int __x;
  maxwell_dist<double> *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 rVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  result_type_conflict2 y_old;
  int i;
  result_type_conflict2 y;
  undefined4 local_24;
  undefined8 local_20;
  maxwell_dist<double> *this_00;
  undefined8 local_8;
  
  if ((in_XMM0_Qa < 0.0) || (1.0 < in_XMM0_Qa)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      this_00 = in_RDI;
      rVar2 = param_type::theta(&in_RDI->P);
      local_20 = rVar2 * 2.0 * 0.7978845608028654;
      for (local_24 = 0; local_24 < 0x37; local_24 = local_24 + 1) {
        rVar2 = cdf(this_00,in_XMM0_Qa);
        __x = (int)in_RDI;
        dVar3 = rVar2 - in_XMM0_Qa;
        rVar2 = pdf(this_00,in_XMM0_Qa);
        local_20 = local_20 - dVar3 / rVar2;
        Catch::clara::std::abs(__x);
        dVar3 = Catch::clara::std::numeric_limits<double>::epsilon();
        if (extraout_XMM0_Qa < dVar3 * 4.0) break;
      }
      local_8 = local_20;
    }
    else {
      local_8 = 0.0;
    }
  }
  else {
    local_8 = std::numeric_limits<double>::infinity();
  }
  return local_8;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      if (x == 0)
        return 0;
      result_type y(2 * P.theta() * math::constants<result_type>::sqrt_2_over_pi);
      for (int i{0}; i < math::numeric_limits<result_type>::digits + 2; ++i) {
        result_type y_old = y;
        y -= (cdf(y) - x) / pdf(y);
        if (math::abs(y / y_old - 1) < 4 * math::numeric_limits<result_type>::epsilon())
          break;
      }
      return y;
    }